

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

I31New * __thiscall MixedArena::alloc<wasm::I31New>(MixedArena *this)

{
  I31New *pIVar1;
  
  pIVar1 = (I31New *)allocSpace(this,0x18,8);
  (pIVar1->super_SpecificExpression<(wasm::Expression::Id)54>).super_Expression._id = I31NewId;
  (pIVar1->super_SpecificExpression<(wasm::Expression::Id)54>).super_Expression.type.id = 0;
  return pIVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }